

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_surface.cxx
# Opt level: O3

void __thiscall xray_re::xr_surface::save(xr_surface *this,xr_writer *w)

{
  uint32_t local_1c;
  uint32_t local_18 [2];
  
  xr_writer::w_sz(w,&this->m_name);
  xr_writer::w_sz(w,&this->m_eshader);
  xr_writer::w_sz(w,&this->m_cshader);
  xr_writer::w_sz(w,&this->m_gamemtl);
  xr_writer::w_sz(w,&this->m_texture);
  xr_writer::w_sz(w,&this->m_vmap);
  local_1c = this->m_flags;
  (*w->_vptr_xr_writer[2])(w,&local_1c,4);
  local_18[0] = this->m_fvf;
  (*w->_vptr_xr_writer[2])(w,local_18,4);
  local_18[1] = 1;
  (*w->_vptr_xr_writer[2])(w,local_18 + 1,4);
  return;
}

Assistant:

void xr_surface::save(xr_writer& w) const
{
	w.w_sz(m_name);
	w.w_sz(m_eshader);
	w.w_sz(m_cshader);
	w.w_sz(m_gamemtl);
	w.w_sz(m_texture);
	w.w_sz(m_vmap);
	w.w_u32(m_flags);
	w.w_u32(m_fvf);
	w.w_u32(1);
}